

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O0

FT_Fixed PS_Conv_ToFixed(FT_Byte **cursor,FT_Byte *limit,FT_Long power_ten)

{
  char cVar1;
  bool bVar2;
  FT_Byte *pFVar3;
  FT_Long FVar4;
  bool bVar5;
  FT_Long exponent;
  FT_Char c;
  FT_Bool have_underflow;
  FT_Bool have_overflow;
  long lStack_50;
  FT_Bool sign;
  FT_Long divider;
  FT_Long decimal;
  FT_Fixed integral;
  FT_Byte *curp;
  FT_Byte *p;
  FT_Long power_ten_local;
  FT_Byte *limit_local;
  FT_Byte **cursor_local;
  
  curp = *cursor;
  decimal = 0;
  divider = 0;
  lStack_50 = 1;
  bVar5 = false;
  exponent._6_1_ = false;
  exponent._5_1_ = false;
  if (curp < limit) {
    if ((*curp == '-') || (*curp == '+')) {
      bVar5 = *curp == '-';
      curp = curp + 1;
      if (curp == limit) goto LAB_00309551;
      if ((*curp == '-') || (*curp == '+')) {
        return 0;
      }
    }
    pFVar3 = curp;
    p = (FT_Byte *)power_ten;
    power_ten_local = (FT_Long)limit;
    limit_local = (FT_Byte *)cursor;
    if (*curp != '.') {
      decimal = PS_Conv_ToInt(&curp,limit);
      if (curp == pFVar3) {
        return 0;
      }
      bVar2 = decimal < 0x8000;
      if (bVar2) {
        decimal = (FT_Long)(uint)((int)decimal << 0x10);
      }
      exponent._6_1_ = !bVar2;
    }
    if ((curp < (ulong)power_ten_local) && (*curp == '.')) {
      while ((((curp = curp + 1, curp < (ulong)power_ten_local &&
               ((((*curp != ' ' && (*curp != '\r')) && (*curp != '\n')) &&
                ((*curp != '\t' && (*curp != '\f')))))) && (*curp != '\0')) &&
             (((*curp < 0x80 && (cVar1 = ft_char_table[(int)(*curp & 0x7f)], -1 < cVar1)) &&
              (cVar1 < '\n'))))) {
        if ((lStack_50 < 0xccccccc) && (divider < 0xccccccc)) {
          divider = divider * 10 + (long)cVar1;
          if ((decimal == 0) && (0 < (long)p)) {
            p = p + -1;
          }
          else {
            lStack_50 = lStack_50 * 10;
          }
        }
      }
    }
    if ((curp + 1 < (ulong)power_ten_local) && ((*curp == 'e' || (*curp == 'E')))) {
      pFVar3 = curp + 1;
      curp = pFVar3;
      FVar4 = PS_Conv_ToInt(&curp,(FT_Byte *)power_ten_local);
      if (pFVar3 == curp) {
        return 0;
      }
      if (FVar4 < 0x3e9) {
        if (-0x3e9 < FVar4) {
          p = p + FVar4;
        }
        exponent._5_1_ = -0x3e9 >= FVar4;
      }
      else {
        exponent._6_1_ = true;
      }
    }
    *(FT_Byte **)limit_local = curp;
    if ((decimal == 0) && (divider == 0)) {
      cursor_local = (FT_Byte **)0x0;
    }
    else {
      if (exponent._6_1_) {
LAB_0030955b:
        decimal = 0x7fffffff;
      }
      else {
        if (exponent._5_1_) {
          return 0;
        }
        for (; 0 < (long)p; p = p + -1) {
          if (0xccccccb < decimal) goto LAB_0030955b;
          decimal = decimal * 10;
          if (divider < 0xccccccc) {
            divider = divider * 10;
          }
          else {
            if (lStack_50 == 1) goto LAB_0030955b;
            lStack_50 = lStack_50 / 10;
          }
        }
        for (; (long)p < 0; p = p + 1) {
          decimal = decimal / 10;
          if (lStack_50 < 0xccccccc) {
            lStack_50 = lStack_50 * 10;
          }
          else {
            divider = divider / 10;
          }
          if ((decimal == 0) && (divider == 0)) {
            return 0;
          }
        }
        if (divider != 0) {
          FVar4 = FT_DivFix(divider,lStack_50);
          decimal = FVar4 + decimal;
        }
      }
      if (bVar5) {
        decimal = -decimal;
      }
      cursor_local = (FT_Byte **)decimal;
    }
  }
  else {
LAB_00309551:
    cursor_local = (FT_Byte **)0x0;
  }
  return (FT_Fixed)cursor_local;
}

Assistant:

FT_LOCAL_DEF( FT_Fixed )
  PS_Conv_ToFixed( FT_Byte**  cursor,
                   FT_Byte*   limit,
                   FT_Long    power_ten )
  {
    FT_Byte*  p = *cursor;
    FT_Byte*  curp;

    FT_Fixed  integral = 0;
    FT_Long   decimal  = 0;
    FT_Long   divider  = 1;

    FT_Bool   sign           = 0;
    FT_Bool   have_overflow  = 0;
    FT_Bool   have_underflow = 0;


    if ( p >= limit )
      goto Bad;

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    /* read the integer part */
    if ( *p != '.' )
    {
      curp     = p;
      integral = PS_Conv_ToInt( &p, limit );

      if ( p == curp )
        return 0;

      if ( integral > 0x7FFF )
        have_overflow = 1;
      else
        integral = (FT_Fixed)( (FT_UInt32)integral << 16 );
    }

    /* read the decimal part */
    if ( p < limit && *p == '.' )
    {
      p++;

      for ( ; p < limit; p++ )
      {
        FT_Char  c;


        if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
          break;

        c = ft_char_table[*p & 0x7F];

        if ( c < 0 || c >= 10 )
          break;

        /* only add digit if we don't overflow */
        if ( divider < 0xCCCCCCCL && decimal < 0xCCCCCCCL )
        {
          decimal = decimal * 10 + c;

          if ( !integral && power_ten > 0 )
            power_ten--;
          else
            divider *= 10;
        }
      }
    }

    /* read exponent, if any */
    if ( p + 1 < limit && ( *p == 'e' || *p == 'E' ) )
    {
      FT_Long  exponent;


      p++;

      curp     = p;
      exponent = PS_Conv_ToInt( &p, limit );

      if ( curp == p )
        return 0;

      /* arbitrarily limit exponent */
      if ( exponent > 1000 )
        have_overflow = 1;
      else if ( exponent < -1000 )
        have_underflow = 1;
      else
        power_ten += exponent;
    }

    *cursor = p;

    if ( !integral && !decimal )
      return 0;

    if ( have_overflow )
      goto Overflow;
    if ( have_underflow )
      goto Underflow;

    while ( power_ten > 0 )
    {
      if ( integral >= 0xCCCCCCCL )
        goto Overflow;
      integral *= 10;

      if ( decimal >= 0xCCCCCCCL )
      {
        if ( divider == 1 )
          goto Overflow;
        divider /= 10;
      }
      else
        decimal *= 10;

      power_ten--;
    }

    while ( power_ten < 0 )
    {
      integral /= 10;
      if ( divider < 0xCCCCCCCL )
        divider *= 10;
      else
        decimal /= 10;

      if ( !integral && !decimal )
        goto Underflow;

      power_ten++;
    }

    if ( decimal )
    {
      decimal = FT_DivFix( decimal, divider );
      /* it's not necessary to check this addition for overflow */
      /* due to the structure of the real number representation */
      integral += decimal;
    }

  Exit:
    if ( sign )
      integral = -integral;

    return integral;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;

  Overflow:
    integral = 0x7FFFFFFFL;
    FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    goto Exit;

  Underflow:
    FT_TRACE4(( "!!!UNDERFLOW:!!!" ));
    return 0;
  }